

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int build_loop_tree(gen_ctx_t gen_ctx)

{
  int iVar1;
  loop_node_t_conflict plVar2;
  loop_node_t_conflict *__base;
  size_t __nmemb;
  bb_t_conflict pbVar3;
  bb_t_conflict local_40;
  bb_t_conflict bb_1;
  size_t i;
  bb_t_conflict bb;
  in_edge_t_conflict peStack_20;
  int loops_p;
  edge_t_conflict e;
  loop_node_t_conflict loop_node;
  gen_ctx_t gen_ctx_local;
  
  bb._4_4_ = 0;
  gen_ctx->curr_loop_node_index = 0;
  enumerate_bbs(gen_ctx);
  VARR_loop_node_ttrunc(gen_ctx->loop_entries,0);
  i = (size_t)DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs);
  do {
    if (i == 0) {
      __base = VARR_loop_node_taddr(gen_ctx->loop_entries);
      __nmemb = VARR_loop_node_tlength(gen_ctx->loop_entries);
      qsort(__base,__nmemb,8,compare_bb_loop_nodes);
      bb_1 = (bb_t_conflict)0x0;
      while( true ) {
        pbVar3 = (bb_t_conflict)VARR_loop_node_tlength(gen_ctx->loop_entries);
        if (pbVar3 <= bb_1) break;
        plVar2 = VARR_loop_node_tget(gen_ctx->loop_entries,(size_t)bb_1);
        iVar1 = process_loop(gen_ctx,plVar2->bb);
        if (iVar1 != 0) {
          bb._4_4_ = 1;
        }
        bb_1 = (bb_t_conflict)((long)&bb_1->index + 1);
      }
      plVar2 = create_loop_node(gen_ctx,(bb_t_conflict)0x0);
      gen_ctx->curr_cfg->root_loop_node = plVar2;
      for (local_40 = DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs); local_40 != (bb_t_conflict)0x0;
          local_40 = DLIST_bb_t_next(local_40)) {
        plVar2 = top_loop_node(local_40);
        if (plVar2 != gen_ctx->curr_cfg->root_loop_node) {
          DLIST_loop_node_t_append(&gen_ctx->curr_cfg->root_loop_node->children,plVar2);
          plVar2->parent = gen_ctx->curr_cfg->root_loop_node;
        }
      }
      setup_loop_pressure(gen_ctx,gen_ctx->curr_cfg->root_loop_node);
      return bb._4_4_;
    }
    plVar2 = create_loop_node(gen_ctx,(bb_t_conflict)i);
    plVar2->entry = plVar2;
    for (peStack_20 = DLIST_in_edge_t_head((DLIST_in_edge_t *)(i + 0x30));
        peStack_20 != (in_edge_t_conflict)0x0; peStack_20 = DLIST_in_edge_t_next(peStack_20)) {
      if (peStack_20->back_edge_p != '\0') {
        VARR_loop_node_tpush(gen_ctx->loop_entries,plVar2);
        break;
      }
    }
    i = (size_t)DLIST_bb_t_next((bb_t_conflict)i);
  } while( true );
}

Assistant:

static int build_loop_tree (gen_ctx_t gen_ctx) {
  loop_node_t loop_node;
  edge_t e;
  int loops_p = FALSE;

  curr_loop_node_index = 0;
  enumerate_bbs (gen_ctx);
  VARR_TRUNC (loop_node_t, loop_entries, 0);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    loop_node = create_loop_node (gen_ctx, bb);
    loop_node->entry = loop_node;
    for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e))
      if (e->back_edge_p) {
        VARR_PUSH (loop_node_t, loop_entries, loop_node);
        break;
      }
  }
  qsort (VARR_ADDR (loop_node_t, loop_entries), VARR_LENGTH (loop_node_t, loop_entries),
         sizeof (loop_node_t), compare_bb_loop_nodes);
  for (size_t i = 0; i < VARR_LENGTH (loop_node_t, loop_entries); i++)
    if (process_loop (gen_ctx, VARR_GET (loop_node_t, loop_entries, i)->bb)) loops_p = TRUE;
  curr_cfg->root_loop_node = create_loop_node (gen_ctx, NULL);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    if ((loop_node = top_loop_node (bb)) != curr_cfg->root_loop_node) {
      DLIST_APPEND (loop_node_t, curr_cfg->root_loop_node->children, loop_node);
      loop_node->parent = curr_cfg->root_loop_node;
    }
  setup_loop_pressure (gen_ctx, curr_cfg->root_loop_node);
  return loops_p;
}